

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerCPP::emit_push_constant_block(CompilerCPP *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *type_00;
  mapped_type *pmVar3;
  Bitset *this_00;
  CompilerError *this_01;
  char (*ts_3) [3];
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string instance_name;
  string buffer_name;
  Bitset *flags;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerCPP *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  this_00 = &(pmVar3->decoration).decoration_flags;
  bVar1 = Bitset::get(this_00,0x21);
  if (!bVar1) {
    bVar1 = Bitset::get(this_00,0x22);
    if (!bVar1) {
      emit_block_struct(this,type_00);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                ((undefined1 *)((long)&instance_name.field_2 + 8),this,(ulong)uVar2,1);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_78,this,(ulong)uVar2,1);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                (&local_98,this,type_00,(ulong)uVar2);
      CompilerGLSL::
      statement<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [24])"internal::PushConstant<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&instance_name.field_2 + 8),&local_98,(char (*) [3])0x4af333,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (char (*) [2])0x4af37c);
      ::std::__cxx11::string::~string((string *)&local_98);
      ts_3 = (char (*) [3])0x4a4971;
      CompilerGLSL::
      statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[7]>
                (&this->super_CompilerGLSL,(char (*) [9])"#define ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (char (*) [9])" __res->",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (char (*) [7])0x4a4971);
      join<char_const(&)[26],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
                (&local_b8,(spirv_cross *)"s.register_push_constant(",(char (*) [26])local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x49743a,
                 (char (*) [3])0x4af37b,ts_3);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&this->resource_registrations,&local_b8);
      ::std::__cxx11::string::~string((string *)&local_b8);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x48ca95);
      ::std::__cxx11::string::~string((string *)local_78);
      ::std::__cxx11::string::~string((string *)(instance_name.field_2._M_local_buf + 8));
      return;
    }
  }
  this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError
            (this_01,
             "Push constant blocks cannot be compiled to GLSL with Binding or Set syntax. Remap to location with reflection API first or disable these decorations."
            );
  __cxa_throw(this_01,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerCPP::emit_push_constant_block(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);
	auto &flags = ir.meta[var.self].decoration.decoration_flags;
	if (flags.get(DecorationBinding) || flags.get(DecorationDescriptorSet))
		SPIRV_CROSS_THROW("Push constant blocks cannot be compiled to GLSL with Binding or Set syntax. "
		                  "Remap to location with reflection API first or disable these decorations.");

	emit_block_struct(type);
	auto buffer_name = to_name(type.self);
	auto instance_name = to_name(var.self);

	statement("internal::PushConstant<", buffer_name, type_to_array_glsl(type, var.self), "> ", instance_name, ";");
	statement_no_indent("#define ", instance_name, " __res->", instance_name, ".get()");
	resource_registrations.push_back(join("s.register_push_constant(", instance_name, "__", ");"));
	statement("");
}